

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O3

void uc_invalidate_tb(uc_struct_conflict15 *uc,uint64_t start_addr,size_t len)

{
  int iVar1;
  tb_page_addr_t tVar2;
  ulong end;
  
  iVar1 = uc->nested_level;
  uc->nested_level = iVar1 + 1;
  iVar1 = __sigsetjmp(uc->jmp_bufs + iVar1,0);
  if (iVar1 == 0) {
    tVar2 = get_page_addr_code_tricore
                      ((CPUArchState_conflict30 *)uc->cpu->env_ptr,(target_ulong_conflict)start_addr
                      );
    uc->nested_level = uc->nested_level + -1;
    end = (ulong)(uint)((int)len + (int)tVar2);
    if ((tVar2 & 0xffffffff) <= end) {
      tb_invalidate_phys_range_tricore(uc,tVar2 & 0xffffffff,end);
    }
  }
  else {
    uc->nested_level = uc->nested_level + -1;
  }
  return;
}

Assistant:

static void uc_invalidate_tb(struct uc_struct *uc, uint64_t start_addr, size_t len) 
{
    tb_page_addr_t start, end;

    uc->nested_level++;
    if (sigsetjmp(uc->jmp_bufs[uc->nested_level - 1], 0) != 0) {
        // We a get cpu fault in get_page_addr_code, ignore it.
        uc->nested_level--;
        return;
    }

    // GPA to ram addr
    // https://raw.githubusercontent.com/android/platform_external_qemu/master/docs/QEMU-MEMORY-MANAGEMENT.TXT
    // start_addr : GPA
    // start (returned): ram addr
    // (GPA -> HVA via memory_region_get_ram_addr(mr) + GPA + block->host,
    // GVA -> GPA via tlb & softmmu
    // HVA -> HPA via host mmu)
    start = get_page_addr_code(uc->cpu->env_ptr, start_addr) & (target_ulong)(-1);

    uc->nested_level--;

    // For 32bit target.
    end = (start + len) & (target_ulong)(-1);

    // We get a wrap?
    if (start > end) {
        return;
    }

    tb_invalidate_phys_range(uc, start, end);
}